

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

void __thiscall Network::Client::ScopedLock::ScopedLock(ScopedLock *this,Lock *a)

{
  Lock *a_local;
  ScopedLock *this_local;
  
  this->a = a;
  SpinLock::acquire(a);
  return;
}

Assistant:

ScopedLock(Lock & a) : a(a) { a.acquire(); }